

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::hugeint_t,long>
          (BaseAppender *this,Vector *col,hugeint_t input)

{
  long lVar1;
  hugeint_t input_00;
  
  input_00.upper = (Cast *)input.lower;
  input_00.lower = input.upper;
  lVar1 = Cast::Operation<duckdb::hugeint_t,long>(input_00.upper,input_00);
  *(long *)(col->data + (this->chunk).count * 8) = lVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}